

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::RepeatedFieldHelper<8>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  uint8 uVar1;
  undefined8 in_RAX;
  uint8 *puVar2;
  RepeatedField<bool> *array;
  long lVar3;
  undefined8 uStack_38;
  
  if (0 < *field) {
    lVar3 = 0;
    uStack_38 = in_RAX;
    do {
      uStack_38 = CONCAT44(md->tag,(undefined4)uStack_38);
      PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
      uVar1 = *(uint8 *)(*(long *)((long)field + 8) + lVar3);
      if ((output->impl_).end_ <= output->cur_) {
        puVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
        output->cur_ = puVar2;
      }
      puVar2 = output->cur_;
      *puVar2 = uVar1;
      output->cur_ = puVar2 + 1;
      lVar3 = lVar3 + 1;
    } while (lVar3 < *field);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }